

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::UListLeaf::insert
          (UListLeaf *this,LeafData *ld)

{
  Lhs *in_RSI;
  Lhs *in_RDI;
  Lhs *in_stack_ffffffffffffff98;
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> **in_stack_ffffffffffffffe8;
  
  Inferences::ALASCA::BinaryResolutionConf::Lhs::Lhs(in_RDI,in_stack_ffffffffffffff98);
  Lib::List<Inferences::ALASCA::BinaryResolutionConf::Lhs>::push(in_RSI,in_stack_ffffffffffffffe8);
  Inferences::ALASCA::BinaryResolutionConf::Lhs::~Lhs((Lhs *)0x428916);
  *(int *)((long)&(in_RDI->super_SelectedLiteral).interpreted.
                  super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                  ._elem._elem + 8) =
       *(int *)((long)&(in_RDI->super_SelectedLiteral).interpreted.
                       super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                       ._elem._elem + 8) + 1;
  return;
}

Assistant:

inline
  void insert(LeafData ld) final override
  {
    LDList::push(ld, _children);
    _size++;
  }